

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,RelocType relocType)

{
  RelocEntry *pRVar1;
  RelocType in_EDX;
  undefined8 *in_RSI;
  ZoneAllocator *in_RDI;
  RelocEntry *re;
  uint32_t relocId;
  Error _err;
  RelocEntry **in_stack_ffffffffffffffb8;
  ZoneAllocator *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint32_t uVar2;
  Error local_c;
  
  local_c = ZoneVector<asmjit::v1_14::RelocEntry_*>::willGrow
                      ((ZoneVector<asmjit::v1_14::RelocEntry_*> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(uint32_t)((ulong)in_RDI >> 0x20));
  if (local_c == 0) {
    uVar2 = *(uint32_t *)(in_RDI + 0x110);
    if (uVar2 == 0xffffffff) {
      local_c = DebugUtils::errored(0x16);
    }
    else {
      pRVar1 = ZoneAllocator::allocZeroedT<asmjit::v1_14::RelocEntry>
                         (in_RDI,(size_t)in_stack_ffffffffffffffb8);
      if (pRVar1 == (RelocEntry *)0x0) {
        local_c = DebugUtils::errored(1);
      }
      else {
        pRVar1->_id = uVar2;
        pRVar1->_relocType = in_EDX;
        pRVar1->_sourceSectionId = 0xffffffff;
        pRVar1->_targetSectionId = 0xffffffff;
        ZoneVector<asmjit::v1_14::RelocEntry_*>::appendUnsafe
                  ((ZoneVector<asmjit::v1_14::RelocEntry_*> *)in_RDI,in_stack_ffffffffffffffb8);
        *in_RSI = pRVar1;
        local_c = 0;
      }
    }
  }
  return local_c;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, RelocType relocType) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_allocator));

  uint32_t relocId = _relocations.size();
  if (ASMJIT_UNLIKELY(relocId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyRelocations);

  RelocEntry* re = _allocator.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorOutOfMemory);

  re->_id = relocId;
  re->_relocType = relocType;
  re->_sourceSectionId = Globals::kInvalidId;
  re->_targetSectionId = Globals::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}